

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

ExpressionResultBuilder * __thiscall
Catch::ExpressionLhs<std::_Rb_tree_const_iterator<int>const&>::
captureExpression<(Catch::Internal::Operator)1,std::_Rb_tree_const_iterator<int>>
          (ExpressionLhs<std::_Rb_tree_const_iterator<int>const&> *this,
          _Rb_tree_const_iterator<int> *rhs)

{
  undefined4 uVar1;
  undefined1 *local_80 [2];
  undefined1 local_70 [16];
  undefined4 *local_60;
  undefined8 local_58;
  undefined4 local_50 [4];
  undefined4 *local_40;
  undefined8 local_38;
  undefined4 local_30 [4];
  
  uVar1 = 0x11;
  if ((_Base_ptr)**(long **)(this + 0x228) != rhs->_M_node) {
    uVar1 = 0;
  }
  *(undefined4 *)(this + 0x40) = uVar1;
  local_30[0] = 0x7d3f7b;
  local_38 = 3;
  local_40 = local_30;
  std::__cxx11::string::_M_assign((string *)(this + 0x50));
  local_50[0] = 0x7d3f7b;
  local_58 = 3;
  local_60 = local_50;
  std::__cxx11::string::_M_assign((string *)(this + 0x70));
  local_80[0] = local_70;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_80,"!=","");
  std::__cxx11::string::_M_assign((string *)(this + 0x90));
  if (local_80[0] != local_70) {
    operator_delete(local_80[0]);
  }
  if (local_60 != local_50) {
    operator_delete(local_60);
  }
  if (local_40 != local_30) {
    operator_delete(local_40);
  }
  return (ExpressionResultBuilder *)this;
}

Assistant:

ExpressionResultBuilder& captureExpression( RhsT const& rhs ) {
        return m_result
            .setResultType( Internal::compare<Op>( m_lhs, rhs ) )
            .setLhs( Catch::toString( m_lhs ) )
            .setRhs( Catch::toString( rhs ) )
            .setOp( Internal::OperatorTraits<Op>::getName() );
    }